

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void blkmar_guards(monst *shkp)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  byte bVar5;
  uint uVar6;
  monst *mtmp;
  
  if (blkmar_guards_rlock == '\0') {
    blkmar_guards_rlock = 1;
    hot_pursuit(shkp);
    mtmp = level->monlist;
    if (mtmp != (monst *)0x0) {
      bVar2 = false;
      do {
        if ((((0 < mtmp->mhp) && (mtmp->mtame == '\0')) &&
            (*(char *)((long)(mtmp->mtrack + 0x18) + (long)mtmp->mxlth) != '\0')) &&
           ((mtmp != shkp && ((*(uint *)&mtmp->field_0x60 & 0x400000) != 0)))) {
          uVar1 = *(uint *)&level->locations[mtmp->mx][mtmp->my].field_0x6;
          uVar6 = uVar1 >> 0x10 & 0x3f;
          bVar5 = 0;
          if (((uVar1 >> 0x16 & 1) == 0 && 2 < uVar6) && ('\x11' < level->rooms[uVar6 - 3].rtype)) {
            bVar5 = (byte)(uVar1 >> 0x10) & 0x3f;
          }
          if (bVar5 == (byte)shkp[0x1b].meating) {
            if (!bVar2) {
              pcVar4 = noit_Monnam(shkp);
              iVar3 = pronoun_gender(level,shkp);
              pline("%s calls for %s assistants!",pcVar4,genders[iVar3].his);
            }
            wakeup(mtmp);
            bVar2 = true;
          }
        }
        mtmp = mtmp->nmon;
      } while (mtmp != (monst *)0x0);
    }
    blkmar_guards_rlock = '\0';
  }
  return;
}

Assistant:

void blkmar_guards(struct monst *shkp)
{
	struct monst *mt;
	struct eshk *eshkp = ESHK(shkp);
	boolean mesg_given = FALSE; /* Only give message if assistants peaceful */
	static boolean rlock = FALSE; /* Prevent recursive calls (via wakeup) */

	if (rlock) return;
	rlock = TRUE;

	/* allow black marketeer to leave his shop */
	hot_pursuit(shkp);

	/* wake up assistants */
	for (mt = level->monlist; mt; mt = mt->nmon) {
	    if (DEADMONSTER(mt)) continue;
	    /* non-tame named monsters are presumably
	     * black marketeer's assistants */
	    if (!mt->mtame && NAME(mt) && *NAME(mt) && mt->mpeaceful &&
		mt != shkp && inside_shop(level, mt->mx, mt->my) == eshkp->shoproom) {
		if (!mesg_given) {
		    pline("%s calls for %s assistants!",
			    noit_Monnam(shkp), mhis(level, shkp));
		    mesg_given = TRUE;
		}
		wakeup(mt);
	    }
	}
	rlock = FALSE;
}